

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O3

size_t Imf_2_5::bytesPerDeepLineTable
                 (Header *header,int minY,int maxY,char *base,int xStride,int yStride,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer puVar6;
  uint uVar7;
  int iVar8;
  Box2i *pBVar9;
  ChannelList *this;
  const_iterator cVar10;
  const_iterator cVar11;
  ConstIterator CVar12;
  ulong uVar13;
  uint uVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  int *piVar24;
  
  pBVar9 = Header::dataWindow(header);
  this = Header::channels(header);
  cVar10._M_node = (_Base_ptr)ChannelList::begin(this);
  cVar11._M_node = (_Base_ptr)ChannelList::end(this);
  if (cVar10._M_node != cVar11._M_node) {
    do {
      uVar2 = *(uint *)&cVar10._M_node[9]._M_parent;
      uVar7 = -uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2;
      }
      uVar3 = *(uint *)&cVar10._M_node[9].field_0x4;
      iVar8 = pixelTypeSize(cVar10._M_node[9]._M_color);
      iVar21 = minY + -1 + uVar7;
      iVar21 = iVar21 - iVar21 % (int)uVar7;
      iVar16 = maxY - maxY % (int)uVar7;
      if (iVar21 <= iVar16) {
        iVar4 = (pBVar9->min).x;
        iVar17 = (pBVar9->max).x;
        uVar7 = -uVar3;
        if (0 < (int)uVar3) {
          uVar7 = uVar3;
        }
        iVar17 = iVar17 - iVar17 % (int)uVar7;
        iVar20 = iVar4 + uVar7 + -1;
        uVar14 = iVar20 % (int)uVar7;
        iVar20 = iVar20 - uVar14;
        iVar5 = (pBVar9->min).y;
        puVar6 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar22 = (long)iVar21;
        uVar23 = -uVar2;
        uVar3 = uVar2;
        if ((int)uVar2 < 1) {
          uVar3 = uVar23;
        }
        piVar15 = (int *)(base + (long)iVar20 * (long)xStride + yStride * lVar22);
        if (uVar2 != uVar23 && SBORROW4(uVar2,uVar23) == (int)(uVar2 * 2) < 0) {
          uVar23 = uVar2;
        }
        do {
          if (iVar17 < iVar20) {
            lVar18 = 0;
          }
          else {
            iVar21 = 0;
            lVar18 = (long)(int)(~uVar14 + iVar4 + uVar7);
            piVar24 = piVar15;
            do {
              iVar21 = iVar21 + *piVar24 * iVar8;
              lVar18 = lVar18 + (ulong)uVar7;
              piVar24 = (int *)((long)piVar24 + (long)xStride * (ulong)uVar7);
            } while (lVar18 <= iVar17);
            lVar18 = (long)iVar21;
          }
          puVar1 = puVar6 + (lVar22 - iVar5);
          *puVar1 = *puVar1 + lVar18;
          lVar22 = lVar22 + (ulong)uVar3;
          piVar15 = (int *)((long)piVar15 + (ulong)uVar23 * (long)yStride);
        } while (lVar22 <= iVar16);
      }
      cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar10._M_node);
      CVar12 = ChannelList::end(this);
    } while ((const_iterator)cVar10._M_node != CVar12._i._M_node);
  }
  if (maxY < minY) {
    uVar13 = 0;
  }
  else {
    lVar22 = 0;
    uVar19 = 0;
    do {
      uVar13 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start[(minY + lVar22) - (long)(pBVar9->min).y];
      if (uVar13 < uVar19) {
        uVar13 = uVar19;
      }
      lVar22 = lVar22 + 1;
      uVar19 = uVar13;
    } while ((maxY - minY) + 1 != (int)lVar22);
  }
  return uVar13;
}

Assistant:

size_t
bytesPerDeepLineTable (const Header &header,
                       int minY, int maxY,
                       const char* base,
                       int xStride,
                       int yStride,
                       vector<size_t> &bytesPerLine)
{
    const Box2i &dataWindow = header.dataWindow();
    const ChannelList &channels = header.channels();

    for (ChannelList::ConstIterator c = channels.begin();
         c != channels.end();
         ++c)
    {
        const int ySampling = abs(c.channel().ySampling);
        const int xSampling = abs(c.channel().xSampling);
        const int pixelSize = pixelTypeSize (c.channel().type);

        // Here we transform from the domain over all pixels into the domain
        // of actual samples.  We want to sample points in [minY, maxY] where
        // (y % ySampling) == 0.  However, doing this by rejecting samples
        // requires O(height*width) modulo computations, which were a
        // significant bottleneck in the previous implementation of this
        // function.  For the low, low price of 4 divisions per channel, we
        // can tighten the y & x ranges to the least and greatest roots of the
        // sampling function and then stride by the sampling rate.
        const int sampleMinY = roundToNextMultiple(minY, ySampling);
        const int sampleMaxY = roundToPrevMultiple(maxY, ySampling);
        const int sampleMinX = roundToNextMultiple(dataWindow.min.x, xSampling);
        const int sampleMaxX = roundToPrevMultiple(dataWindow.max.x, xSampling);

        for (int y = sampleMinY; y <= sampleMaxY; y+=ySampling)
        {
            int nBytes = 0;
            for (int x = sampleMinX; x <= sampleMaxX; x += xSampling)
            {
                nBytes += pixelSize *
                          sampleCount(base, xStride, yStride, x, y);
            }
            bytesPerLine[y - dataWindow.min.y] += nBytes;
        }
    }

    size_t maxBytesPerLine = 0;

    for (int y = minY; y <= maxY; ++y)
        if (maxBytesPerLine < bytesPerLine[y - dataWindow.min.y])
            maxBytesPerLine = bytesPerLine[y - dataWindow.min.y];

    return maxBytesPerLine;
}